

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

intvector sptk::swipe::primes(int n)

{
  uint uVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  intvector iVar6;
  intvector ones;
  
  iVar6 = onesiv(n);
  ones.v = iVar6.v;
  uVar1 = iVar6.x;
  ones._0_8_ = ones.v;
  iVar6.x = sieve((swipe *)(ulong)uVar1,ones);
  piVar2 = (int *)malloc((long)(int)iVar6.x << 2);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    iVar4 = 0;
    do {
      if (ones.v[uVar3] == 1) {
        lVar5 = (long)iVar4;
        iVar4 = iVar4 + 1;
        piVar2[lVar5] = (int)uVar3 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  free(ones.v);
  iVar6._4_4_ = 0;
  iVar6.v = piVar2;
  return iVar6;
}

Assistant:

intvector primes(int n) {
    int i, j = 0;
    intvector myOnes = onesiv(n);
    intvector myPrimes = makeiv(sieve(myOnes)); // size of the # of primes
    for (i = 0; i < myOnes.x; i++) // could start at 1
        if PRIME(myOnes.v[i])
            myPrimes.v[j++] = i + 1;
    freeiv(myOnes);
    return(myPrimes);
}